

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChConstraintTuple.h
# Opt level: O3

double __thiscall
chrono::ChConstraintTuple_3vars<chrono::ChVariableTupleCarrier_3vars<3,_3,_3>_>::Compute_Cq_q
          (ChConstraintTuple_3vars<chrono::ChVariableTupleCarrier_3vars<3,_3,_3>_> *this)

{
  double dVar1;
  double *local_38;
  long local_30;
  undefined1 *local_20;
  undefined1 local_18 [8];
  
  dVar1 = 0.0;
  if (this->variables_1->disabled == false) {
    ChVariables::Get_qb((ChVectorRef *)&local_38,this->variables_1);
    if (local_30 != 3) goto LAB_005594f6;
    local_20 = local_18;
    dVar1 = (this->Cq_1).super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.
            m_data.array[0] * *local_38 +
            (this->Cq_1).super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.
            m_data.array[1] * local_38[1] +
            (this->Cq_1).super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.
            m_data.array[2] * local_38[2] + 0.0;
  }
  if (this->variables_2->disabled == false) {
    ChVariables::Get_qb((ChVectorRef *)&local_38,this->variables_2);
    if (local_30 != 3) goto LAB_005594f6;
    local_20 = local_18;
    dVar1 = dVar1 + (this->Cq_2).super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.
                    m_storage.m_data.array[0] * *local_38 +
                    (this->Cq_2).super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.
                    m_storage.m_data.array[1] * local_38[1] +
                    (this->Cq_2).super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.
                    m_storage.m_data.array[2] * local_38[2];
  }
  if (this->variables_3->disabled == false) {
    ChVariables::Get_qb((ChVectorRef *)&local_38,this->variables_3);
    if (local_30 != 3) {
LAB_005594f6:
      __assert_fail("lhs.cols() == rhs.rows() && \"invalid matrix product\" && \"if you wanted a coeff-wise or a dot product use the respective explicit functions\""
                    ,"/usr/include/eigen3/Eigen/src/Core/Product.h",0x62,
                    "Eigen::Product<Eigen::Matrix<double, 1, 3>, Eigen::Ref<Eigen::Matrix<double, -1, 1>>>::Product(const Lhs &, const Rhs &) [Lhs = Eigen::Matrix<double, 1, 3>, Rhs = Eigen::Ref<Eigen::Matrix<double, -1, 1>>, Option = 0]"
                   );
    }
    dVar1 = dVar1 + (this->Cq_3).super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.
                    m_storage.m_data.array[0] * *local_38 +
                    (this->Cq_3).super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.
                    m_storage.m_data.array[1] * local_38[1] +
                    (this->Cq_3).super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.
                    m_storage.m_data.array[2] * local_38[2];
  }
  return dVar1;
}

Assistant:

double Compute_Cq_q() {
        double ret = 0;

        if (variables_1->IsActive()) {
            ret += Cq_1 * variables_1->Get_qb();
        }

        if (variables_2->IsActive()) {
            ret += Cq_2 * variables_2->Get_qb();
        }

        if (variables_3->IsActive()) {
            ret += Cq_3 * variables_3->Get_qb();
        }

        return ret;
    }